

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::jacobiSVD<float>
               (Matrix44<float> *A,Matrix44<float> *U,Vec4<float> *S,Matrix44<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  Matrix44<float> *in_RDI;
  byte in_R8B;
  Matrix44<float> *in_stack_00000068;
  Matrix44<float> *in_stack_00000070;
  Matrix44<float> MStack_68;
  byte local_25;
  
  local_25 = in_R8B & 1;
  Matrix44<float>::Matrix44(&MStack_68,in_RDI);
  anon_unknown_20::twoSidedJacobiSVD<float>
            (in_stack_00000070,in_stack_00000068,(Vec4<float> *)A,U,S._4_4_,S._3_1_);
  return;
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec4<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}